

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O1

void __thiscall
TransitionObservationIndependentMADPDiscrete::IndividualToJointActionIndices
          (TransitionObservationIndependentMADPDiscrete *this)

{
  Scope *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  
  IndividualToJointActionIndices
            ((TransitionObservationIndependentMADPDiscrete *)
             (&(this->super_MultiAgentDecisionProcess).field_0x0 +
             *(long *)(*(long *)&this->super_MultiAgentDecisionProcess + -0xb8)),in_RSI,in_RDX);
  return;
}

Assistant:

Index IndividualToJointActionIndices(
        const std::vector<Index>& ja_e, const Scope& agSC) const
        {
            // identical to MADPComponentDiscreteActions
            std::vector<size_t> nr_A_e(agSC.size());
            IndexTools::RestrictIndividualIndicesToScope(
                GetNrActions(), agSC, nr_A_e);
            Index jaI = IndexTools::IndividualToJointIndices( ja_e, nr_A_e);
            return(jaI);
        }